

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::DateTruncBinaryOperator,bool,true,false>
               (string_t *ldata,timestamp_t *rdata,timestamp_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  DateTruncBinaryOperator *pDVar3;
  char *pcVar4;
  timestamp_t tVar5;
  timestamp_t tVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  idx_t iVar10;
  ulong uVar11;
  ulong uVar12;
  string_t specifier;
  string_t specifier_00;
  string_t specifier_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      pDVar3 = *(DateTruncBinaryOperator **)&ldata->value;
      pcVar4 = (ldata->value).pointer.ptr;
      iVar10 = 0;
      tVar6.value = count;
      do {
        specifier_01.value.pointer.ptr = (char *)rdata[iVar10].value;
        specifier_01.value._0_8_ = pcVar4;
        tVar5 = DateTruncBinaryOperator::
                Operation<duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t>
                          (pDVar3,specifier_01,tVar6);
        result_data[iVar10].value = tVar5.value;
        iVar10 = iVar10 + 1;
      } while (count != iVar10);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar7 = 0;
    uVar11 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar8 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar8 = count;
        }
LAB_01b409e2:
        uVar9 = uVar11;
        if (uVar11 < uVar8) {
          pDVar3 = *(DateTruncBinaryOperator **)&ldata->value;
          pcVar4 = (ldata->value).pointer.ptr;
          tVar6.value = uVar7;
          do {
            specifier.value.pointer.ptr = (char *)rdata[uVar11].value;
            specifier.value._0_8_ = pcVar4;
            tVar5 = DateTruncBinaryOperator::
                    Operation<duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t>
                              (pDVar3,specifier,tVar6);
            result_data[uVar11].value = tVar5.value;
            uVar11 = uVar11 + 1;
            uVar9 = uVar8;
          } while (uVar8 != uVar11);
        }
      }
      else {
        uVar2 = puVar1[uVar7];
        uVar8 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar8 = count;
        }
        uVar9 = uVar8;
        if (uVar2 != 0) {
          if (uVar2 == 0xffffffffffffffff) goto LAB_01b409e2;
          uVar9 = uVar11;
          if (uVar11 < uVar8) {
            uVar12 = 0;
            tVar6.value = uVar7;
            do {
              if ((uVar2 >> (uVar12 & 0x3f) & 1) != 0) {
                specifier_00.value.pointer.ptr = (char *)rdata[uVar11 + uVar12].value;
                specifier_00.value._0_8_ = (ldata->value).pointer.ptr;
                tVar6 = DateTruncBinaryOperator::
                        Operation<duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t>
                                  (*(DateTruncBinaryOperator **)&ldata->value,specifier_00,tVar6);
                (result_data + uVar11)[uVar12].value = tVar6.value;
                tVar6.value = (int64_t)(result_data + uVar11);
              }
              uVar12 = uVar12 + 1;
              uVar9 = uVar8;
            } while (uVar8 - uVar11 != uVar12);
          }
        }
      }
      uVar7 = uVar7 + 1;
      uVar11 = uVar9;
    } while (uVar7 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}